

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O1

Ref<embree::XML> __thiscall embree::XML::childOpt(XML *this,string *childID)

{
  pointer pcVar1;
  void *__s2;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _func_int *__n;
  int iVar4;
  undefined8 *in_RDX;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  pcVar1 = childID[4]._M_dataplus._M_p;
  lVar6 = childID[4]._M_string_length - (long)pcVar1;
  bVar8 = lVar6 != 0;
  if (bVar8) {
    uVar7 = lVar6 >> 3;
    __s2 = (void *)*in_RDX;
    p_Var2 = (_func_int *)in_RDX[1];
    uVar5 = 1;
    do {
      pp_Var3 = *(_func_int ***)(pcVar1 + uVar5 * 8 + -8);
      __n = pp_Var3[7];
      if ((__n == p_Var2) &&
         ((__n == (_func_int *)0x0 || (iVar4 = bcmp(pp_Var3[6],__s2,(size_t)__n), iVar4 == 0)))) {
        (this->super_RefCount)._vptr_RefCount = pp_Var3;
        if (pp_Var3 != (_func_int **)0x0) {
          (**(code **)(*pp_Var3 + 0x10))(pp_Var3);
        }
        if (bVar8) {
          return (Ref<embree::XML>)this;
        }
        break;
      }
      bVar8 = uVar5 < uVar7;
      lVar6 = (-(ulong)(uVar7 == 0) - uVar7) + uVar5;
      uVar5 = uVar5 + 1;
    } while (lVar6 != 0);
  }
  (this->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
  return (Ref<embree::XML>)this;
}

Assistant:

const Ref<XML> childOpt(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      return null;
    }